

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inlined_vector.h
# Opt level: O0

void __thiscall
absl::lts_20250127::inlined_vector_internal::
Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>
::
Initialize<absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,absl::lts_20250127::str_format_internal::FormatArgImpl_const*>>
          (Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>
           *this,IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>
                 values,
          SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> new_size
          )

{
  bool bVar1;
  SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> SVar2;
  SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> SVar3;
  allocator<absl::lts_20250127::str_format_internal::FormatArgImpl> *paVar4;
  Allocation<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> allocation_00;
  Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> local_48;
  Allocation<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> allocation;
  SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
  requested_capacity;
  Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> construct_data;
  SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> local_20;
  SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_> new_size_local;
  Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
  *this_local;
  IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>
  values_local;
  
  local_20 = new_size;
  new_size_local =
       (SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>)this;
  this_local = (Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                *)values.it_;
  bVar1 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
          ::GetIsAllocated((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                            *)this);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::
    Initialize<absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>_>
    ::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&construct_data + 7));
  }
  SVar2 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
          ::GetSize((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                     *)this);
  if (SVar2 != 0) {
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::
    Initialize<absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>_>
    ::anon_class_1_0_00000001::operator()((anon_class_1_0_00000001 *)((long)&construct_data + 6));
  }
  SVar2 = local_20;
  SVar3 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
          ::GetInlinedCapacity
                    ((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                      *)this);
  if (SVar3 < SVar2) {
    SVar2 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
            ::GetInlinedCapacity
                      ((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                        *)this);
    SVar2 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
            ::ComputeCapacity(SVar2,local_20);
    paVar4 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
             ::GetAllocator((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                             *)this);
    allocation_00 =
         MallocAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_false>
         ::Allocate(paVar4,SVar2);
    local_48 = allocation_00.data;
    requested_capacity =
         (SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>)local_48
    ;
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::SetAllocation((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                     *)this,allocation_00);
    Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
    ::SetIsAllocated((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                      *)this);
  }
  else {
    requested_capacity =
         (SizeType<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>)
         Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
         ::GetInlinedData((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                           *)this);
  }
  paVar4 = Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
           ::GetAllocator((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                           *)this);
  ConstructElements<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,absl::lts_20250127::inlined_vector_internal::IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,absl::lts_20250127::str_format_internal::FormatArgImpl_const*>>
            (paVar4,(Pointer<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
                     )requested_capacity,
             (IteratorValueAdapter<std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>,_const_absl::lts_20250127::str_format_internal::FormatArgImpl_*>
              *)&this_local,local_20);
  Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
  ::AddSize((Storage<absl::lts_20250127::str_format_internal::FormatArgImpl,_4UL,_std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>_>
             *)this,local_20);
  return;
}

Assistant:

auto Storage<T, N, A>::Initialize(ValueAdapter values,
                                  SizeType<A> new_size) -> void {
  // Only callable from constructors!
  ABSL_HARDENING_ASSERT(!GetIsAllocated());
  ABSL_HARDENING_ASSERT(GetSize() == 0);

  Pointer<A> construct_data;
  if (new_size > GetInlinedCapacity()) {
    // Because this is only called from the `InlinedVector` constructors, it's
    // safe to take on the allocation with size `0`. If `ConstructElements(...)`
    // throws, deallocation will be automatically handled by `~Storage()`.
    SizeType<A> requested_capacity =
        ComputeCapacity(GetInlinedCapacity(), new_size);
    Allocation<A> allocation =
        MallocAdapter<A>::Allocate(GetAllocator(), requested_capacity);
    construct_data = allocation.data;
    SetAllocation(allocation);
    SetIsAllocated();
  } else {
    construct_data = GetInlinedData();
  }

  ConstructElements<A>(GetAllocator(), construct_data, values, new_size);

  // Since the initial size was guaranteed to be `0` and the allocated bit is
  // already correct for either case, *adding* `new_size` gives us the correct
  // result faster than setting it directly.
  AddSize(new_size);
}